

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,ChunkHeader *header)

{
  bool bVar1;
  reference pMVar2;
  long in_RSI;
  ostream *in_RDI;
  MaskRectRaw m_1;
  MaskRect *tmask;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<MaskRect,_std::allocator<MaskRect>_> *__range1_1;
  MaskRectRaw m;
  MaskRect *mask;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MaskRect,_std::allocator<MaskRect>_> *__range1;
  ChunkHeaderRaw h;
  MaskRect in_stack_ffffffffffffff78;
  MaskRect in_stack_ffffffffffffff80;
  __normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_> local_68;
  long local_60;
  MaskRect local_58;
  reference local_48;
  MaskRect *local_40;
  __normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_> local_38;
  long local_30;
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78.y2);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::size
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)(local_10 + 8));
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78.y2);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::size
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)(local_10 + 0x20));
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78.y2);
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78.y2);
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78.y2);
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78.y2);
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78.y2);
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78.y2);
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::operator=((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *
              )in_stack_ffffffffffffff80,in_stack_ffffffffffffff78._4_4_);
  writeRaw<ChunkHeaderRaw>
            ((ostream *)in_stack_ffffffffffffff80,(ChunkHeaderRaw *)in_stack_ffffffffffffff78);
  local_30 = local_10 + 8;
  local_38._M_current =
       (MaskRect *)
       std::vector<MaskRect,_std::allocator<MaskRect>_>::begin
                 ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_ffffffffffffff78);
  local_40 = (MaskRect *)
             std::vector<MaskRect,_std::allocator<MaskRect>_>::end
                       ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
               ::operator*(&local_38);
    local_58 = *local_48;
    MaskRectRaw::MaskRectRaw((MaskRectRaw *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    writeRaw<MaskRectRaw>
              ((ostream *)in_stack_ffffffffffffff80,(MaskRectRaw *)in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>::
    operator++(&local_38);
  }
  local_60 = local_10 + 0x20;
  local_68._M_current =
       (MaskRect *)
       std::vector<MaskRect,_std::allocator<MaskRect>_>::begin
                 ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_ffffffffffffff78);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::end
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    pMVar2 = __gnu_cxx::
             __normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
             ::operator*(&local_68);
    in_stack_ffffffffffffff78 = *pMVar2;
    MaskRectRaw::MaskRectRaw((MaskRectRaw *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    writeRaw<MaskRectRaw>
              ((ostream *)in_stack_ffffffffffffff80,(MaskRectRaw *)in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<const_MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>::
    operator++(&local_68);
  }
  std::ostream::seekp((long)local_8,(uint)*(ushort *)(local_10 + 0x38) << 1);
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const ChunkHeader& header) {
	ChunkHeaderRaw h;
	h.type = static_cast<uint16_t>(header.type);
	h.masks = header.masks.size();
	h.transparentMasks = header.transparentMasks.size();
	h.alignmentWords = header.alignmentWords;
	h.x = header.x;
	h.y = header.y;
	h.w = header.w;
	h.h = header.h;
	h.size = header.size;
	writeRaw(stream, h);
	for (const auto& mask : header.masks) {
		MaskRectRaw m = mask;
		writeRaw(stream, m);
	}
	for (const auto& tmask : header.transparentMasks) {
		MaskRectRaw m = tmask;
		writeRaw(stream, m);
	}
	stream.seekp(header.alignmentWords * 2, stream.cur);
	return stream;
}